

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O3

void __thiscall llvm::FoldingSetNodeID::AddPointer(FoldingSetNodeID *this,void *Ptr)

{
  undefined8 in_RAX;
  uint local_18;
  uint local_14;
  
  _local_18 = CONCAT44((uint)((ulong)in_RAX >> 0x20),(int)Ptr);
  SmallVectorTemplateBase<unsigned_int,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_18);
  _local_18 = CONCAT44((int)((ulong)Ptr >> 0x20),local_18);
  SmallVectorTemplateBase<unsigned_int,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_14);
  return;
}

Assistant:

void FoldingSetNodeID::AddPointer(const void *Ptr) {
  // Note: this adds pointers to the hash using sizes and endianness that
  // depend on the host. It doesn't matter, however, because hashing on
  // pointer values is inherently unstable. Nothing should depend on the
  // ordering of nodes in the folding set.
  static_assert(sizeof(uintptr_t) <= sizeof(unsigned long long),
                "unexpected pointer size");
  AddInteger(reinterpret_cast<uintptr_t>(Ptr));
}